

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::parsing::Trivia>::emplaceRealloc<slang::parsing::Trivia>
          (SmallVectorBase<slang::parsing::Trivia> *this,pointer pos,Trivia *args)

{
  ulong uVar1;
  pointer p;
  undefined8 uVar2;
  pointer pTVar3;
  pointer pTVar4;
  pointer pTVar5;
  long lVar6;
  long lVar7;
  size_type sVar8;
  ulong uVar9;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar9 = this->len + 1;
  uVar1 = this->cap;
  if (uVar9 < uVar1 * 2) {
    uVar9 = uVar1 * 2;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    uVar9 = 0x7ffffffffffffff;
  }
  lVar7 = (long)pos - (long)this->data_;
  pTVar3 = (pointer)operator_new(uVar9 << 4);
  uVar2 = *(undefined8 *)((long)&args->field_0 + 8);
  *(undefined8 *)((long)pTVar3 + lVar7) = (args->field_0).rawText.ptr;
  ((undefined8 *)((long)pTVar3 + lVar7))[1] = uVar2;
  p = this->data_;
  sVar8 = this->len;
  lVar6 = (long)p + (sVar8 * 0x10 - (long)pos);
  pTVar4 = p;
  pTVar5 = pTVar3;
  if (lVar6 == 0) {
    pTVar4 = pTVar3;
    pTVar5 = p;
    if (sVar8 != 0) {
      do {
        uVar2 = *(undefined8 *)((long)&pTVar5->field_0 + 8);
        (pTVar4->field_0).rawText.ptr = (pTVar5->field_0).rawText.ptr;
        *(undefined8 *)((long)&pTVar4->field_0 + 8) = uVar2;
        pTVar5 = pTVar5 + 1;
        pTVar4 = pTVar4 + 1;
      } while (pTVar5 != pos);
    }
  }
  else {
    for (; pTVar4 != pos; pTVar4 = pTVar4 + 1) {
      uVar2 = *(undefined8 *)((long)&pTVar4->field_0 + 8);
      (pTVar5->field_0).rawText.ptr = (pTVar4->field_0).rawText.ptr;
      *(undefined8 *)((long)&pTVar5->field_0 + 8) = uVar2;
      pTVar5 = pTVar5 + 1;
    }
    memcpy((void *)((long)pTVar3 + lVar7 + 0x10),pos,(lVar6 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar8 = this->len;
  }
  this->len = sVar8 + 1;
  this->cap = uVar9;
  this->data_ = pTVar3;
  return (pointer)((long)pTVar3 + lVar7);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}